

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_dynamic_content.cpp
# Opt level: O0

void __thiscall
ServeDynamicContent_BadRequest_Test::~ServeDynamicContent_BadRequest_Test
          (ServeDynamicContent_BadRequest_Test *this)

{
  ServeDynamicContent_BadRequest_Test *this_local;
  
  ~ServeDynamicContent_BadRequest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ServeDynamicContent, BadRequest) {
    std::vector<std::uint8_t> output;
    auto sender = [&output] (int io, pstore::gsl::span<std::uint8_t const> const & s) {
        std::copy (std::begin (s), std::end (s), std::back_inserter (output));
        return pstore::error_or<int>{io};
    };

    int io = 0;
    pstore::error_or<int> const err = pstore::http::serve_dynamic_content (
        sender, io, std::string{pstore::http::dynamic_path} + "bad_request");
    EXPECT_EQ (err.get_error (), make_error_code (pstore::http::error_code::bad_request));
}